

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O1

void variance_api_suite::test_ctor(void)

{
  boost::detail::test_impl
            ("!filter.empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0xe6,"void variance_api_suite::test_ctor()",true);
  boost::detail::test_impl
            ("!copy.empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0xea,"void variance_api_suite::test_ctor()",true);
  boost::detail::test_impl
            ("!assign.empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0xef,"void variance_api_suite::test_ctor()",true);
  boost::detail::test_impl
            ("!mover.empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0xf3,"void variance_api_suite::test_ctor()",true);
  boost::detail::test_impl
            ("!massign.empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0xf8,"void variance_api_suite::test_ctor()",true);
  return;
}

Assistant:

void test_ctor()
{
    interim::moment_variance<double, 4> filter;
    filter.push(1.0);
    TRIAL_TEST(!filter.empty());

    // Copy constructor
    interim::moment_variance<double, 4> copy(filter);
    TRIAL_TEST(!copy.empty());

    // Copy assignment
    interim::moment_variance<double, 4> assign;
    assign = filter;
    TRIAL_TEST(!assign.empty());

    // Move constructor
    interim::moment_variance<double, 4> mover(std::move(copy));
    TRIAL_TEST(!mover.empty());

    // Move assignment
    interim::moment_variance<double, 4> massign;
    massign = std::move(assign);
    TRIAL_TEST(!massign.empty());
}